

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

long passthrough_resampler_fill_eq_input
               (cubeb_stream *stream,void *user_ptr,void *input_buffer,void *output_buffer,
               long nframes)

{
  void *pvVar1;
  int line;
  long lVar2;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult gtest_ar;
  AssertHelper local_48;
  long local_40;
  void *local_38;
  
  local_68.ptr_._0_4_ = 0x20;
  local_40 = nframes;
  local_38 = input_buffer;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"nframes","32",&local_40,(int *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x38a;
LAB_0010a1e1:
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,line,message);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pvVar1 = local_38;
    for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"input[i]","0.01 * i",*(float *)((long)pvVar1 + lVar2 * 4),
                 (float)(int)lVar2 * 0.01);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x38d;
        goto LAB_0010a1e1;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
  }
  return nframes;
}

Assistant:

static long
passthrough_resampler_fill_eq_input(cubeb_stream * stream,
                                    void * user_ptr,
                                    void const * input_buffer,
                                    void * output_buffer,
                                    long nframes) {
  // gtest does not support using ASSERT_EQ and friends in a
  // function that returns a value.
  [nframes, input_buffer]() {
    ASSERT_EQ(nframes, 32);
    const float* input = static_cast<const float*>(input_buffer);
    for (int i = 0; i < 64; ++i) {
      ASSERT_FLOAT_EQ(input[i], 0.01 * i);
    }
  }();
  return nframes;
}